

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voccomp.c
# Opt level: O3

void vociren(voccxdef *ctx,objnum oldnum,objnum newnum)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  vocdef **ppvVar4;
  int iVar5;
  undefined6 in_register_00000012;
  vocdef *pvVar6;
  ulong uVar7;
  undefined6 in_register_00000032;
  ulong uVar8;
  vocwdef *pvVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar7 = CONCAT62(in_register_00000032,oldnum) & 0xffffffff;
  vocialo(ctx,newnum);
  uVar3 = uVar7 >> 8;
  uVar8 = (ulong)(((uint)CONCAT62(in_register_00000032,oldnum) & 0xff) << 3);
  uVar10 = CONCAT62(in_register_00000012,newnum) >> 8 & 0xffffff;
  uVar11 = (ulong)(((uint)CONCAT62(in_register_00000012,newnum) & 0xff) << 3);
  *(undefined8 *)((long)ctx->voccxinh[uVar10] + uVar11) =
       *(undefined8 *)((long)ctx->voccxinh[uVar3] + uVar8);
  *(undefined8 *)((long)ctx->voccxinh[uVar3] + uVar8) = 0;
  pbVar1 = (byte *)(*(long *)((long)ctx->voccxinh[uVar10] + uVar11) + 8);
  *pbVar1 = *pbVar1 | 1;
  ppvVar4 = ctx->voccxhsh;
  iVar5 = 0x100;
  do {
    for (pvVar6 = *ppvVar4; pvVar6 != (vocdef *)0x0; pvVar6 = pvVar6->vocnxt) {
      uVar2 = pvVar6->vocwlst;
      if ((uVar2 != 0xffffffff) && (ctx->voccxwp[(ulong)uVar2 / 2000] != (vocwdef *)0x0)) {
        pvVar9 = ctx->voccxwp[(ulong)uVar2 / 2000] + uVar2 % 2000;
        do {
          if (pvVar9->vocwobj == (objnum)uVar7) {
            pvVar9->vocwobj = newnum;
            pvVar9->vocwflg = pvVar9->vocwflg | 1;
          }
          uVar2 = pvVar9->vocwnxt;
        } while ((uVar2 != 0xffffffff) &&
                (pvVar9 = ctx->voccxwp[(ulong)uVar2 / 2000] + uVar2 % 2000,
                ctx->voccxwp[(ulong)uVar2 / 2000] != (vocwdef *)0x0));
      }
    }
    ppvVar4 = ppvVar4 + 1;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void vociren(voccxdef *ctx, objnum oldnum, objnum newnum)
{
    int       i;
    vocdef   *v;
    vocdef  **vp;
    vocwdef  *vw;


    /* make sure we have a page table entry for the original object */
    vocialo(ctx, newnum);

    /* move the old object's inheritance record to the new slot */
    vocinh(ctx, newnum) = vocinh(ctx, oldnum);
    vocinh(ctx, oldnum) = 0;

    /* make the old object an honorary class object */
    vocinh(ctx, newnum)->vociflg |= VOCIFCLASS;

    /* 
     *   Renumber any vocabulary associated with the old object to the new
     *   object.
     */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i != 0 ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (v = *vp ; v != 0 ; v = v->vocnxt)
        {
            /* go through all vocwdef's defined for this word */
            for (vw = vocwget(ctx, v->vocwlst) ; vw ;
                 vw = vocwget(ctx, vw->vocwnxt))
            {
                /* 
                 *   renumber this word and mark it as being associated
                 *   with a class if it's associated with the original
                 *   object 
                 */
                if (vw->vocwobj == oldnum)
                {
                    vw->vocwobj = newnum;
                    vw->vocwflg |= VOCFCLASS;
                }
            }
        }
    }
}